

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O0

tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
 __thiscall
pstore::http::
socket_read<pstore::http::buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>&,pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(&)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (http *this,
          buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
          *reader,_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *sender,
          reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
          io,not_null<pstore::http::ws_command_*> command)

{
  int iVar1;
  opcode oVar2;
  storage_type<pstore::gsl::details::extent_type<_1L>_> sVar3;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> rVar4;
  undefined8 uVar5;
  bool bVar6;
  type *ptVar7;
  size_type sVar8;
  ws_command *pwVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  ws_command *pwVar10;
  _Head_base<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_false>
  extraout_RDX;
  close_status_code cVar11;
  error_code eVar12;
  tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
  tVar13;
  bool local_289;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_288;
  ws_command *local_278;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_270;
  bool local_251;
  ws_command *local_250;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_248;
  bool local_229;
  ws_command *local_228;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_220;
  bool local_201;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
  local_200;
  bool local_1f1;
  ws_command *local_1f0;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_1e8;
  bool local_1c9;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
  local_1c8;
  uchar *local_1c0;
  uchar *local_1b8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a8;
  const_iterator local_1a0;
  bool local_191;
  ws_command *local_190;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_188;
  bool local_169;
  ws_command *local_168;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_160;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
  local_148;
  frame *wsp;
  ws_command *local_138;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_130;
  ws_command *local_118;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_110;
  error_code local_f8;
  ws_command *local_e8;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_e0;
  error_code local_c8;
  undefined1 local_b8 [8];
  error_code error;
  error_code local_98;
  undefined1 local_88 [40];
  undefined1 local_60 [8];
  error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_frame>
  eo;
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *sender_local;
  buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *reader_local;
  not_null<pstore::http::ws_command_*> command_local;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_local
  ;
  
  local_88._32_8_ = io._M_data;
  eo._40_8_ = sender;
  reader_local = (buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                  *)command.ptr_;
  command_local.ptr_ = (ws_command *)io._M_data;
  read_frame<pstore::http::buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
            ((error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_frame>
              *)local_60,(http *)reader,
             (buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)io._M_data,
             (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
              )io._M_data);
  bVar6 = pstore::error_or::operator_cast_to_bool((error_or *)local_60);
  if (!bVar6) {
    eVar12 = error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>_>
             ::get_error((error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>_>
                          *)local_60);
    cVar11 = (close_status_code)command.ptr_;
    local_98._M_cat = eVar12._M_cat;
    local_98._M_value = eVar12._M_value;
    std::error_code::message_abi_cxx11_((string *)local_88,&local_98);
    log<std::__cxx11::string>
              (error,"Error: ",
               (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<pstore::gsl::not_null<pstore::brokerface::channel<pstore::descriptor_condition_variable>_*>,_pstore::gsl::not_null<pstore::descriptor_condition_variable_*>_>_>,_true>
                *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    eVar12 = error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>_>
             ::get_error((error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>_>
                          *)local_60);
    error._0_8_ = eVar12._M_cat;
    local_b8._0_4_ = eVar12._M_value;
    eVar12 = make_error_code(unmasked_frame);
    local_c8._M_cat = eVar12._M_cat;
    local_c8._M_value = eVar12._M_value;
    bVar6 = std::operator==((error_code *)local_b8,&local_c8);
    if (bVar6) {
      local_e8 = command_local.ptr_;
      send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (&local_e0,(http *)eo._40_8_,
                 (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *)command_local.ptr_,
                 (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  )0x3ea,cVar11);
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
      ::~error_or(&local_e0);
    }
    else {
      eVar12 = make_error_code(reserved_bit_set);
      local_f8._M_cat = eVar12._M_cat;
      local_f8._M_value = eVar12._M_value;
      bVar6 = std::operator==((error_code *)local_b8,&local_f8);
      if (bVar6) {
        local_118 = command_local.ptr_;
        send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                  (&local_110,(http *)eo._40_8_,
                   (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                    *)command_local.ptr_,
                   (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                    )0x3ea,cVar11);
        error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
        ::~error_or(&local_110);
      }
      else {
        local_138 = command_local.ptr_;
        send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                  (&local_130,(http *)eo._40_8_,
                   (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                    *)command_local.ptr_,
                   (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                    )0x3ee,cVar11);
        error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
        ::~error_or(&local_130);
      }
    }
    wsp._7_1_ = 1;
    std::
    tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
    ::
    tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool,_true>
              ((tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
                *)this,(reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                        *)&command_local,(bool *)((long)&wsp + 7));
    goto LAB_00120016;
  }
  ptVar7 = get<0ul,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>
                     ((error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>
                       *)local_60);
  command_local.ptr_ = (ws_command *)ptVar7->_M_data;
  local_148._M_data =
       (descriptor<pstore::details::posix_descriptor_traits> *)
       get<1ul,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>
                 ((error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>
                   *)local_60);
  bVar6 = is_control_frame_opcode(((type *)local_148._M_data)->op);
  if ((bVar6) &&
     ((((local_148._M_data)->field_0x4 & 1) == 0 ||
      (sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          ((long)local_148._M_data + 8)), 0x7d < sVar8)))) {
    local_168 = command_local.ptr_;
    send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_160,(http *)eo._40_8_,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)command_local.ptr_,
               (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                )0x3ea,(close_status_code)command.ptr_);
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
    ::~error_or(&local_160);
    local_169 = true;
    std::
    tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
    ::
    tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool,_true>
              ((tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
                *)this,(reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                        *)&command_local,&local_169);
    goto LAB_00120016;
  }
  uVar5 = eo._40_8_;
  sVar3.data_ = local_288.data_;
  sVar3.super_extent_type<_1L>.size_ = local_288.super_extent_type<_1L>.size_;
  iVar1 = (local_148._M_data)->fd_;
  if (iVar1 == 0) {
    pwVar9 = pstore::gsl::not_null<pstore::http::ws_command_*>::operator->
                       ((not_null<pstore::http::ws_command_*> *)&reader_local);
    cVar11 = (close_status_code)command.ptr_;
    bVar6 = is_control_frame_opcode(pwVar9->op);
    if (bVar6) {
      local_190 = command_local.ptr_;
      send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (&local_188,(http *)eo._40_8_,
                 (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *)command_local.ptr_,
                 (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  )0x3ea,cVar11);
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
      ::~error_or(&local_188);
      local_191 = true;
      std::
      tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
      ::
      tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool,_true>
                ((tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
                  *)this,(reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                          *)&command_local,&local_191);
      goto LAB_00120016;
    }
    pwVar9 = pstore::gsl::not_null<pstore::http::ws_command_*>::operator->
                       ((not_null<pstore::http::ws_command_*> *)&reader_local);
    pwVar10 = pstore::gsl::not_null<pstore::http::ws_command_*>::operator->
                        ((not_null<pstore::http::ws_command_*> *)&reader_local);
    local_1a8._M_current =
         (uchar *)std::end<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            (&pwVar10->payload);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_1a0,&local_1a8);
    local_1b0._M_current =
         (uchar *)std::begin<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             ((long)local_148._M_data + 8));
    local_1b8 = (uchar *)std::end<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    ((long)local_148._M_data + 8));
    local_1c0 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                         insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                   ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                    &pwVar9->payload,local_1a0,local_1b0,
                                    (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     )local_1b8);
    uVar5 = eo._40_8_;
    rVar4._M_data = local_148._M_data;
    local_1c8._M_data = (descriptor<pstore::details::posix_descriptor_traits> *)command_local.ptr_;
    pwVar9 = pstore::gsl::not_null<pstore::http::ws_command_*>::operator->
                       ((not_null<pstore::http::ws_command_*> *)&reader_local);
    pwVar10 = pstore::gsl::not_null<pstore::http::ws_command_*>::operator->
                        ((not_null<pstore::http::ws_command_*> *)&reader_local);
    bVar6 = check_message_complete<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                      ((_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                        *)uVar5,local_1c8,(frame *)rVar4._M_data,&pwVar9->op,&pwVar10->payload);
    if (!bVar6) {
      local_1c9 = true;
      std::
      tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
      ::
      tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool,_true>
                ((tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
                  *)this,(reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                          *)&command_local,&local_1c9);
      goto LAB_00120016;
    }
  }
  else {
    if (iVar1 - 1U < 2) {
      pwVar9 = pstore::gsl::not_null<pstore::http::ws_command_*>::operator->
                         ((not_null<pstore::http::ws_command_*> *)&reader_local);
      cVar11 = (close_status_code)command.ptr_;
      if (pwVar9->op == unknown) {
        pwVar9 = pstore::gsl::not_null<pstore::http::ws_command_*>::operator->
                           ((not_null<pstore::http::ws_command_*> *)&reader_local);
        bVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&pwVar9->payload);
        if (bVar6) {
          __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                ((long)local_148._M_data + 8);
          pwVar9 = pstore::gsl::not_null<pstore::http::ws_command_*>::operator->
                             ((not_null<pstore::http::ws_command_*> *)&reader_local);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&pwVar9->payload,__x);
          oVar2 = (local_148._M_data)->fd_;
          pwVar9 = pstore::gsl::not_null<pstore::http::ws_command_*>::operator->
                             ((not_null<pstore::http::ws_command_*> *)&reader_local);
          uVar5 = eo._40_8_;
          rVar4._M_data = local_148._M_data;
          pwVar9->op = oVar2;
          local_200._M_data =
               (descriptor<pstore::details::posix_descriptor_traits> *)command_local.ptr_;
          pwVar9 = pstore::gsl::not_null<pstore::http::ws_command_*>::operator->
                             ((not_null<pstore::http::ws_command_*> *)&reader_local);
          pwVar10 = pstore::gsl::not_null<pstore::http::ws_command_*>::operator->
                              ((not_null<pstore::http::ws_command_*> *)&reader_local);
          bVar6 = check_message_complete<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                            ((_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                              *)uVar5,local_200,(frame *)rVar4._M_data,&pwVar9->op,&pwVar10->payload
                            );
          if (!bVar6) {
            local_201 = true;
            std::
            tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
            ::
            tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool,_true>
                      ((tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
                        *)this,(reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                                *)&command_local,&local_201);
            goto LAB_00120016;
          }
          goto LAB_0011ffee;
        }
      }
      local_1f0 = command_local.ptr_;
      send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (&local_1e8,(http *)eo._40_8_,
                 (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *)command_local.ptr_,
                 (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  )0x3ea,cVar11);
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
      ::~error_or(&local_1e8);
      local_1f1 = true;
      std::
      tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
      ::
      tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool,_true>
                ((tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
                  *)this,(reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                          *)&command_local,&local_1f1);
      goto LAB_00120016;
    }
    if (iVar1 - 3U < 5) {
LAB_0011fe89:
      local_228 = command_local.ptr_;
      send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (&local_220,(http *)eo._40_8_,
                 (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *)command_local.ptr_,
                 (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  )0x3ea,(close_status_code)command.ptr_);
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
      ::~error_or(&local_220);
      local_229 = true;
      std::
      tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
      ::
      tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool,_true>
                ((tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
                  *)this,(reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                          *)&command_local,&local_229);
      goto LAB_00120016;
    }
    if (iVar1 == 8) {
      local_250 = command_local.ptr_;
      close_message<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (&local_248,(http *)eo._40_8_,
                 (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *)command_local.ptr_,local_148,(frame *)command.ptr_);
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
      ::~error_or(&local_248);
      local_251 = true;
      std::
      tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
      ::
      tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool,_true>
                ((tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
                  *)this,(reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                          *)&command_local,&local_251);
      goto LAB_00120016;
    }
    if (iVar1 == 9) {
      local_278 = command_local.ptr_;
      local_288 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                  pstore::gsl::make_span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (local_148._M_data + 1));
      pong<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (&local_270,(http *)uVar5,
                 (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *)local_278,(descriptor<pstore::details::posix_descriptor_traits> *)&local_288,
                 (span<const_unsigned_char,__1L> *)command.ptr_);
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
      ::~error_or(&local_270);
    }
    else if (iVar1 != 10) {
      if (iVar1 - 0xbU < 5) goto LAB_0011fe89;
      local_288 = sVar3;
      if (iVar1 == 0xff) {
        assert_failed("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/ws_server.hpp"
                      ,0x237);
      }
    }
  }
LAB_0011ffee:
  local_289 = false;
  std::
  tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
  ::
  tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool,_true>
            ((tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
              *)this,(reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                      *)&command_local,&local_289);
LAB_00120016:
  wsp._0_4_ = 1;
  error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>_>
  ::~error_or((error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>_>
               *)local_60);
  tVar13.
  super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
  .
  super__Head_base<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_false>
  ._M_head_impl._M_data = extraout_RDX._M_head_impl._M_data;
  tVar13.
  super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
  ._0_8_ = this;
  return (tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
          )tVar13.
           super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
  ;
}

Assistant:

std::tuple<IO, bool> socket_read (Reader && reader, Sender && sender, IO io,
                                          gsl::not_null<ws_command *> const command) {
            error_or_n<IO, frame> const eo = read_frame (reader, io);
            if (!eo) {
                log (logger::priority::error, "Error: ", eo.get_error ().message ());
                auto const error = eo.get_error ();
                if (error == make_error_code (ws_error::unmasked_frame)) {
                    // "The server MUST close the connection upon receiving a frame that is not
                    // masked.  In this case, a server MAY send a Close frame with a status code
                    // of 1002 (protocol error)."
                    send_close_frame (sender, io, close_status_code::protocol_error);
                } else if (error == make_error_code (ws_error::reserved_bit_set)) {
                    send_close_frame (sender, io, close_status_code::protocol_error);
                } else {
                    send_close_frame (sender, io, close_status_code::abnormal_closure);
                }
                return std::tuple<IO, bool>{std::move (io), true};
            }

            io = get<0> (eo);
            frame const & wsp = get<1> (eo);

            // "All control frames MUST have a payload length of 125 bytes or less and MUST
            // NOT be fragmented."
            if (is_control_frame_opcode (wsp.op) && (!wsp.fin || wsp.payload.size () > 125)) {
                send_close_frame (sender, io, close_status_code::protocol_error);
                return std::tuple<IO, bool>{std::move (io), true};
            }

            switch (wsp.op) {
            case opcode::continuation:
                if (is_control_frame_opcode (command->op)) {
                    send_close_frame (sender, io, close_status_code::protocol_error);
                    return std::tuple<IO, bool>{std::move (io), true};
                }
                command->payload.insert (std::end (command->payload), std::begin (wsp.payload),
                                         std::end (wsp.payload));
                if (!check_message_complete (sender, io, wsp, command->op, command->payload)) {
                    return std::tuple<IO, bool>{std::move (io), true};
                }
                break;

            // Data frame opcodes.
            case opcode::text:
            case opcode::binary:
                // We didn't see a FIN frame before a new data frame.
                if (command->op != opcode::unknown || !command->payload.empty ()) {
                    send_close_frame (sender, io, close_status_code::protocol_error);
                    return std::tuple<IO, bool>{std::move (io), true};
                }

                command->payload = std::move (wsp.payload);
                command->op = wsp.op;
                if (!check_message_complete (sender, io, wsp, command->op, command->payload)) {
                    return std::tuple<IO, bool>{std::move (io), true};
                }
                break;

            case opcode::reserved_nc_1:
            case opcode::reserved_nc_2:
            case opcode::reserved_nc_3:
            case opcode::reserved_nc_4:
            case opcode::reserved_nc_5:
            case opcode::reserved_control_1:
            case opcode::reserved_control_2:
            case opcode::reserved_control_3:
            case opcode::reserved_control_4:
            case opcode::reserved_control_5:
                send_close_frame (sender, io, close_status_code::protocol_error);
                return std::tuple<IO, bool>{std::move (io), true};

            case opcode::close:
                close_message (sender, io, wsp);
                return std::tuple<IO, bool>{std::move (io), true};

            case opcode::ping: pong (sender, io, gsl::make_span (wsp.payload)); break;

            case opcode::pong:
                // TODO: A reply to a ping that we sent.
                break;

            case opcode::unknown: PSTORE_ASSERT (0); break;
            }
            return std::tuple<IO, bool>{std::move (io), false};
        }